

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::LegacyReporterAdapter::assertionEnded
          (LegacyReporterAdapter *this,AssertionStats *assertionStats)

{
  pointer pMVar1;
  IReporter *pIVar2;
  string *psVar3;
  allocator local_391;
  AssertionStats *local_390;
  LegacyReporterAdapter *local_388;
  AssertionInfo info;
  AssertionResult result;
  ExpressionResultBuilder expressionBuilder;
  
  local_390 = assertionStats;
  local_388 = this;
  if ((assertionStats->assertionResult).m_resultData.resultType != Ok) {
    pMVar1 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (psVar3 = (string *)
                  &((assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start)->message;
        (pointer)(psVar3 + -0x50) != pMVar1; psVar3 = psVar3 + 0x78) {
      if (*(int *)(psVar3 + -8) == 1) {
        ExpressionResultBuilder::ExpressionResultBuilder(&expressionBuilder,Info);
        std::operator<<((ostream *)&expressionBuilder.m_stream,psVar3);
        std::__cxx11::string::string((string *)&result,"",&local_391);
        AssertionInfo::AssertionInfo
                  (&info,(string *)(psVar3 + -0x50),(SourceLineInfo *)(psVar3 + -0x30),
                   (string *)&result,Normal);
        std::__cxx11::string::~string((string *)&result);
        ExpressionResultBuilder::buildResult(&result,&expressionBuilder,&info);
        pIVar2 = (local_388->m_legacyReporter).m_p;
        (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar2,&result);
        AssertionResult::~AssertionResult(&result);
        AssertionInfo::~AssertionInfo(&info);
        ExpressionResultBuilder::~ExpressionResultBuilder(&expressionBuilder);
      }
    }
  }
  pIVar2 = (local_388->m_legacyReporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
            (pIVar2,&local_390->assertionResult);
  return true;
}

Assistant:

bool LegacyReporterAdapter::assertionEnded( AssertionStats const& assertionStats ) {
        if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
            for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                    it != itEnd;
                    ++it ) {
                if( it->type == ResultWas::Info ) {
                    ExpressionResultBuilder expressionBuilder( it->type );
                        expressionBuilder << it->message;
                    AssertionInfo info( it->macroName, it->lineInfo, "", ResultDisposition::Normal );
                    AssertionResult result = expressionBuilder.buildResult( info );
                    m_legacyReporter->Result( result );
                }
            }
        }
        m_legacyReporter->Result( assertionStats.assertionResult );
        return true;
    }